

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_NestedMessage_Test::TestBody
          (MessageDifferencerTest_IgnoreField_NestedMessage_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar1;
  FieldDescriptor *field;
  allocator<char> local_349;
  string local_348;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&msg1.field_0._impl_.rm_.super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.c_ = 3;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 2;
  RepeatedField<int>::Add(&(pVVar1->field_0)._impl_.rc_,1);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&msg2.field_0._impl_.rm_.super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.c_ = 4;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 2;
  RepeatedField<int>::Add(&(pVVar1->field_0)._impl_.rc_,1);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"rm.c",&local_349);
  field = GetFieldDescriptor(&msg1.super_Message,&local_348);
  util::MessageDifferencer::IgnoreField(&differencer,field);
  std::__cxx11::string::~string((string *)&local_348);
  ExpectEqualsWithDifferencer(&differencer,&msg1.super_Message,&msg2.super_Message);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_NestedMessage) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestField* field;

  field = msg1.add_rm();
  field->set_c(3);
  field->add_rc(1);

  field = msg2.add_rm();
  field->set_c(4);
  field->add_rc(1);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rm.c"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}